

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::verifyCompilers(MakefileGenerator *this)

{
  long lVar1;
  long lVar2;
  ProStringList *this_00;
  ProStringList *pPVar3;
  QList<ProString> *this_01;
  QList<ProString> *this_02;
  char16_t *pcVar4;
  ProString *this_03;
  int idx;
  _List_node_base *this_04;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_ProString_&>,_const_char_(&)[2]> local_e0;
  ProString local_c8;
  ProKey ofkey;
  ProKey okey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_04 = (this->project->super_QMakeEvaluator).m_valuemapStack.
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_next + 1;
  ProKey::ProKey(&okey,"QMAKE_EXTRA_COMPILERS");
  this_00 = QMap<ProKey,_ProStringList>::operator[]((QMap<ProKey,_ProStringList> *)this_04,&okey);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&okey);
  idx = 0;
  do {
    if ((this_00->super_QList<ProString>).d.size <= (long)idx) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    this_03 = (this_00->super_QList<ProString>).d.ptr + idx;
    okey.super_ProString.m_file = -0x55555556;
    okey.super_ProString._36_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_hash._0_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_hash._4_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_string.d.size._0_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_string.d.size._4_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_offset = -0x55555556;
    okey.super_ProString.m_length = -0x55555556;
    okey.super_ProString.m_string.d.d._0_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_string.d.d._4_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_string.d.ptr._0_4_ = 0xaaaaaaaa;
    okey.super_ProString.m_string.d.ptr._4_4_ = 0xaaaaaaaa;
    ofkey.super_ProString.m_string.d.ptr = L".output";
    ofkey.super_ProString.m_string.d.d = (Data *)this_03;
    ProString::ProString<ProString_const&,char_const(&)[8]>
              (&okey.super_ProString,
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&ofkey.super_ProString);
    pPVar3 = QMap<ProKey,_ProStringList>::operator[]
                       ((QMap<ProKey,_ProStringList> *)this_04,(ProKey *)&okey.super_ProString);
    local_c8.m_string.d.d = (Data *)this_03;
    if ((pPVar3->super_QList<ProString>).d.size == 0) {
      ofkey.super_ProString.m_file = -0x55555556;
      ofkey.super_ProString._36_4_ = 0xaaaaaaaa;
      ofkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      ofkey.super_ProString.m_string.d.size = -0x5555555555555556;
      ofkey.super_ProString.m_offset = -0x55555556;
      ofkey.super_ProString.m_length = -0x55555556;
      ofkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      ofkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_c8.m_string.d.ptr = L".output_function";
      ProString::ProString<ProString_const&,char_const(&)[17]>
                (&ofkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[17]> *)&local_c8);
      pPVar3 = QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)this_04,(ProKey *)&ofkey.super_ProString);
      lVar2 = (pPVar3->super_QList<ProString>).d.size;
      if (lVar2 == 0) {
        ProString::toLatin1((QByteArray *)&local_c8,this_03);
        pcVar4 = local_c8.m_string.d.ptr;
        if (local_c8.m_string.d.ptr == (char16_t *)0x0) {
          pcVar4 = (char16_t *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"Compiler: %s: No output file specified",pcVar4);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      }
      else {
        this_01 = &QMap<ProKey,_ProStringList>::operator[]
                             ((QMap<ProKey,_ProStringList> *)this_04,&okey)->super_QList<ProString>;
        this_02 = &QMap<ProKey,_ProStringList>::operator[]
                             ((QMap<ProKey,_ProStringList> *)this_04,
                              (ProKey *)&ofkey.super_ProString)->super_QList<ProString>;
        local_e0.a.b = (ProString *)QList<ProString>::begin(this_02);
        local_e0.a.a = (char (*) [22])0x219fcc;
        local_e0.b = (char (*) [2])0x218f84;
        ProString::ProString<QStringBuilder<char_const(&)[22],ProString&>,char_const(&)[2]>
                  (&local_c8,&local_e0);
        QList<ProString>::emplaceBack<ProString>(this_01,&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ofkey);
      if (lVar2 != 0) goto LAB_0013d1ce;
LAB_0013d1d3:
      ProStringList::removeAt(this_00,idx);
    }
    else {
      local_c8.m_string.d.ptr = L".input";
      ProString::ProString<ProString_const&,char_const(&)[7]>
                (&ofkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_c8);
      pPVar3 = QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)this_04,(ProKey *)&ofkey.super_ProString);
      lVar2 = (pPVar3->super_QList<ProString>).d.size;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&ofkey.super_ProString);
      if (lVar2 == 0) {
        ProString::toLatin1((QByteArray *)&ofkey,this_03);
        pcVar4 = ofkey.super_ProString.m_string.d.ptr;
        if (ofkey.super_ProString.m_string.d.ptr == (char16_t *)0x0) {
          pcVar4 = (char16_t *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"Compiler: %s: No input variable specified",pcVar4);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ofkey);
        goto LAB_0013d1d3;
      }
LAB_0013d1ce:
      idx = idx + 1;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&okey);
  } while( true );
}

Assistant:

void
MakefileGenerator::verifyCompilers()
{
    ProValueMap &v = project->variables();
    ProStringList &quc = v["QMAKE_EXTRA_COMPILERS"];
    for(int i = 0; i < quc.size(); ) {
        bool error = false;
        const ProString &comp = quc.at(i);
        const ProKey okey(comp + ".output");
        if (v[okey].isEmpty()) {
            const ProKey ofkey(comp + ".output_function");
            if (!v[ofkey].isEmpty()) {
                v[okey].append("${QMAKE_FUNC_FILE_IN_" + v[ofkey].first() + "}");
            } else {
                error = true;
                warn_msg(WarnLogic, "Compiler: %s: No output file specified", comp.toLatin1().constData());
            }
        } else if (v[ProKey(comp + ".input")].isEmpty()) {
            error = true;
            warn_msg(WarnLogic, "Compiler: %s: No input variable specified", comp.toLatin1().constData());
        }
        if(error)
            quc.removeAt(i);
        else
            ++i;
    }
}